

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

void icu_63::anon_unknown_7::setAttributesFromKeywords
               (Locale *loc,Collator *coll,UErrorCode *errorCode)

{
  char cVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  uint uVar5;
  char *__s1;
  char *__s2;
  int local_758;
  int32_t code_1;
  int32_t code;
  char c;
  char *limit;
  char *scriptName;
  int local_738;
  int32_t codesLength;
  int32_t codes [190];
  int local_434;
  int local_430;
  int32_t j;
  int32_t i;
  int32_t length;
  char value [1024];
  UErrorCode *errorCode_local;
  Collator *coll_local;
  Locale *loc_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    __s1 = Locale::getName(loc);
    __s2 = Locale::getBaseName(loc);
    iVar3 = strcmp(__s1,__s2);
    if (iVar3 != 0) {
      iVar4 = Locale::getKeywordValue(loc,"colHiraganaQuaternary",(char *)&i,0x400,errorCode);
      UVar2 = ::U_FAILURE(*errorCode);
      if (UVar2 == '\0') {
        if (iVar4 == 0) {
          iVar4 = Locale::getKeywordValue(loc,"variableTop",(char *)&i,0x400,errorCode);
          UVar2 = ::U_FAILURE(*errorCode);
          if (UVar2 == '\0') {
            if (iVar4 == 0) {
              if (*errorCode == U_STRING_NOT_TERMINATED_WARNING) {
                *errorCode = U_ZERO_ERROR;
              }
              for (local_430 = 0; local_430 < 7; local_430 = local_430 + 1) {
                iVar4 = Locale::getKeywordValue
                                  (loc,*(char **)((anonymous_namespace)::collAttributes +
                                                 (long)local_430 * 0x10),(char *)&i,0x400,errorCode)
                ;
                UVar2 = ::U_FAILURE(*errorCode);
                if ((UVar2 != '\0') || (*errorCode == U_STRING_NOT_TERMINATED_WARNING)) {
                  *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                  return;
                }
                if (iVar4 != 0) {
                  local_434 = 0;
                  while( true ) {
                    if (local_434 == 0xb) {
                      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                      return;
                    }
                    iVar3 = uprv_stricmp_63((char *)&i,
                                            *(char **)((anonymous_namespace)::collAttributeValues +
                                                      (long)local_434 * 0x10));
                    if (iVar3 == 0) break;
                    local_434 = local_434 + 1;
                  }
                  (*(coll->super_UObject)._vptr_UObject[0x17])
                            (coll,(ulong)*(uint *)((anonymous_namespace)::collAttributes +
                                                  (long)local_430 * 0x10 + 8),
                             (ulong)*(uint *)((anonymous_namespace)::collAttributeValues +
                                             (long)local_434 * 0x10 + 8),errorCode);
                }
              }
              iVar4 = Locale::getKeywordValue(loc,"colReorder",(char *)&i,0x400,errorCode);
              UVar2 = ::U_FAILURE(*errorCode);
              if ((UVar2 == '\0') && (*errorCode != U_STRING_NOT_TERMINATED_WARNING)) {
                if (iVar4 == 0) {
LAB_00288569:
                  iVar4 = Locale::getKeywordValue(loc,"kv",(char *)&i,0x400,errorCode);
                  UVar2 = ::U_FAILURE(*errorCode);
                  if ((UVar2 == '\0') && (*errorCode != U_STRING_NOT_TERMINATED_WARNING)) {
                    if (iVar4 != 0) {
                      uVar5 = getReorderCode((char *)&i);
                      if ((int)uVar5 < 0) {
                        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                        return;
                      }
                      (*(coll->super_UObject)._vptr_UObject[0x19])(coll,(ulong)uVar5,errorCode);
                    }
                    UVar2 = ::U_FAILURE(*errorCode);
                    if (UVar2 != '\0') {
                      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                    }
                  }
                  else {
                    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                  }
                }
                else {
                  scriptName._4_4_ = 0;
                  limit = (char *)&i;
                  while (scriptName._4_4_ != 0xbe) {
                    for (_code = limit; cVar1 = *_code, cVar1 != '\0' && cVar1 != '-';
                        _code = _code + 1) {
                    }
                    *_code = '\0';
                    if ((long)_code - (long)limit == 4) {
                      local_758 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,limit);
                    }
                    else {
                      local_758 = getReorderCode(limit);
                    }
                    if (local_758 < 0) {
                      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                      return;
                    }
                    (&local_738)[(int)scriptName._4_4_] = local_758;
                    if (cVar1 == '\0') {
                      (*(coll->super_UObject)._vptr_UObject[0x15])
                                (coll,&local_738,(ulong)(scriptName._4_4_ + 1),errorCode);
                      goto LAB_00288569;
                    }
                    limit = _code + 1;
                    scriptName._4_4_ = scriptName._4_4_ + 1;
                  }
                  *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                }
              }
              else {
                *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
              }
            }
            else {
              *errorCode = U_UNSUPPORTED_ERROR;
            }
          }
          else {
            *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
          }
        }
        else {
          *errorCode = U_UNSUPPORTED_ERROR;
        }
      }
      else {
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      }
    }
  }
  return;
}

Assistant:

void setAttributesFromKeywords(const Locale &loc, Collator &coll, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return;
    }
    if (uprv_strcmp(loc.getName(), loc.getBaseName()) == 0) {
        // No keywords.
        return;
    }
    char value[1024];  // The reordering value could be long.
    // Check for collation keywords that were already deprecated
    // before any were supported in createInstance() (except for "collation").
    int32_t length = loc.getKeywordValue("colHiraganaQuaternary", value, UPRV_LENGTHOF(value), errorCode);
    if (U_FAILURE(errorCode)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    if (length != 0) {
        errorCode = U_UNSUPPORTED_ERROR;
        return;
    }
    length = loc.getKeywordValue("variableTop", value, UPRV_LENGTHOF(value), errorCode);
    if (U_FAILURE(errorCode)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    if (length != 0) {
        errorCode = U_UNSUPPORTED_ERROR;
        return;
    }
    // Parse known collation keywords, ignore others.
    if (errorCode == U_STRING_NOT_TERMINATED_WARNING) {
        errorCode = U_ZERO_ERROR;
    }
    for (int32_t i = 0; i < UPRV_LENGTHOF(collAttributes); ++i) {
        length = loc.getKeywordValue(collAttributes[i].name, value, UPRV_LENGTHOF(value), errorCode);
        if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING) {
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        if (length == 0) { continue; }
        for (int32_t j = 0;; ++j) {
            if (j == UPRV_LENGTHOF(collAttributeValues)) {
                errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                return;
            }
            if (uprv_stricmp(value, collAttributeValues[j].name) == 0) {
                coll.setAttribute(collAttributes[i].attr, collAttributeValues[j].value, errorCode);
                break;
            }
        }
    }
    length = loc.getKeywordValue("colReorder", value, UPRV_LENGTHOF(value), errorCode);
    if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    if (length != 0) {
        int32_t codes[USCRIPT_CODE_LIMIT + UCOL_REORDER_CODE_LIMIT - UCOL_REORDER_CODE_FIRST];
        int32_t codesLength = 0;
        char *scriptName = value;
        for (;;) {
            if (codesLength == UPRV_LENGTHOF(codes)) {
                errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                return;
            }
            char *limit = scriptName;
            char c;
            while ((c = *limit) != 0 && c != '-') { ++limit; }
            *limit = 0;
            int32_t code;
            if ((limit - scriptName) == 4) {
                // Strict parsing, accept only 4-letter script codes, not long names.
                code = u_getPropertyValueEnum(UCHAR_SCRIPT, scriptName);
            } else {
                code = getReorderCode(scriptName);
            }
            if (code < 0) {
                errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                return;
            }
            codes[codesLength++] = code;
            if (c == 0) { break; }
            scriptName = limit + 1;
        }
        coll.setReorderCodes(codes, codesLength, errorCode);
    }
    length = loc.getKeywordValue("kv", value, UPRV_LENGTHOF(value), errorCode);
    if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    if (length != 0) {
        int32_t code = getReorderCode(value);
        if (code < 0) {
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        coll.setMaxVariable((UColReorderCode)code, errorCode);
    }
    if (U_FAILURE(errorCode)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
}